

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::computeFrhs1
          (SPxSolverBase<double> *this,VectorBase<double> *ufb,VectorBase<double> *lfb)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  ostream *poVar4;
  undefined8 uVar5;
  double *x_00;
  long in_RDI;
  double x;
  Status stat;
  int i;
  Desc *ds;
  undefined4 in_stack_ffffffffffffff58;
  Status in_stack_ffffffffffffff5c;
  SPxSolverBase<double> *in_stack_ffffffffffffff60;
  SVectorBase<double> *in_stack_ffffffffffffff70;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffff80;
  int iVar7;
  allocator local_51;
  string local_50 [32];
  double local_30;
  Status local_28;
  int local_24;
  Desc *local_20;
  
  local_20 = SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  local_24 = 0;
  do {
    iVar7 = local_24;
    iVar2 = coDim((SPxSolverBase<double> *)0x2555f0);
    if (iVar2 <= iVar7) {
      return;
    }
    local_28 = SPxBasisBase<double>::Desc::status
                         ((Desc *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    bVar1 = isBasic(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (!bVar1) {
      x_00 = (double *)(ulong)(uint)(local_28 + D_ON_BOTH);
      switch(x_00) {
      case (double *)0x0:
      case (double *)0xc:
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff5c);
        local_30 = *pdVar3;
        break;
      default:
        poVar4 = std::operator<<((ostream *)&std::cerr,"ESVECS03 ERROR: ");
        poVar4 = std::operator<<(poVar4,"inconsistent basis must not happen!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        uVar5 = __cxa_allocate_exception(0x28);
        paVar6 = &local_51;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_50,"XSVECS04 This should never happen.",paVar6);
        SPxInternalCodeException::SPxInternalCodeException
                  ((SPxInternalCodeException *)in_stack_ffffffffffffff60,
                   (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      case (double *)0x2:
      case (double *)0xa:
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff5c);
        local_30 = *pdVar3;
        break;
      case (double *)0x4:
      case (double *)0x8:
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff5c);
        local_30 = *pdVar3;
        break;
      case (double *)0x5:
      case (double *)0x7:
      case (double *)0xe:
        goto LAB_00255823;
      }
      if ((local_30 != 0.0) || (NAN(local_30))) {
        in_stack_ffffffffffffff60 = *(SPxSolverBase<double> **)(in_RDI + 0x6a0);
        vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        VectorBase<double>::multAdd<double,double>
                  ((VectorBase<double> *)CONCAT44(iVar7,in_stack_ffffffffffffff80),x_00,
                   in_stack_ffffffffffffff70);
      }
    }
LAB_00255823:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}